

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

xmlChar * xmlBuildQName(xmlChar *ncname,xmlChar *prefix,xmlChar *memory,int len)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  xmlChar *local_40;
  xmlChar *ret;
  int lenp;
  int lenn;
  int len_local;
  xmlChar *memory_local;
  xmlChar *prefix_local;
  xmlChar *ncname_local;
  
  if (ncname == (xmlChar *)0x0) {
    ncname_local = (xmlChar *)0x0;
  }
  else {
    ncname_local = ncname;
    if (prefix != (xmlChar *)0x0) {
      sVar3 = strlen((char *)ncname);
      iVar1 = (int)sVar3;
      sVar3 = strlen((char *)prefix);
      iVar2 = (int)sVar3;
      if (((memory == (xmlChar *)0x0) || (local_40 = memory, len < iVar1 + iVar2 + 2)) &&
         (local_40 = (xmlChar *)(*xmlMalloc)((long)(iVar1 + iVar2 + 2)), local_40 == (xmlChar *)0x0)
         ) {
        ncname_local = (xmlChar *)0x0;
      }
      else {
        memcpy(local_40,prefix,(long)iVar2);
        local_40[iVar2] = ':';
        memcpy(local_40 + (iVar2 + 1),ncname,(long)iVar1);
        local_40[iVar1 + iVar2 + 1] = '\0';
        ncname_local = local_40;
      }
    }
  }
  return ncname_local;
}

Assistant:

xmlChar *
xmlBuildQName(const xmlChar *ncname, const xmlChar *prefix,
	      xmlChar *memory, int len) {
    int lenn, lenp;
    xmlChar *ret;

    if (ncname == NULL) return(NULL);
    if (prefix == NULL) return((xmlChar *) ncname);

#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
    /* Make allocation more likely */
    if (len > 8)
        len = 8;
#endif

    lenn = strlen((char *) ncname);
    lenp = strlen((char *) prefix);

    if ((memory == NULL) || (len < lenn + lenp + 2)) {
	ret = xmlMalloc(lenn + lenp + 2);
	if (ret == NULL)
	    return(NULL);
    } else {
	ret = memory;
    }
    memcpy(&ret[0], prefix, lenp);
    ret[lenp] = ':';
    memcpy(&ret[lenp + 1], ncname, lenn);
    ret[lenn + lenp + 1] = 0;
    return(ret);
}